

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall
discordpp::Channel::Channel
          (Channel *this,field<discordpp::Snowflake> *id,field<int> *type,
          omittable_field<discordpp::Snowflake> *guild_id,omittable_field<int> *position,
          omittable_field<std::vector<discordpp::Overwrite,_std::allocator<discordpp::Overwrite>_>_>
          *permission_overwrites,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *topic,omittable_field<bool> *nsfw,
          nullable_omittable_field<discordpp::Snowflake> *last_message_id,
          omittable_field<int> *bitrate,omittable_field<int> *user_limit,
          omittable_field<int> *rate_limit_per_user,
          omittable_field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>
          *recipients,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *icon,omittable_field<discordpp::Snowflake> *owner_id,
          omittable_field<discordpp::Snowflake> *application_id,omittable_field<bool> *managed,
          nullable_omittable_field<discordpp::Snowflake> *parent_id,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *last_pin_timestamp,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *rtc_region,omittable_field<int> *video_quality_mode,omittable_field<int> *message_count,
          omittable_field<int> *member_count,
          omittable_field<discordpp::ThreadMetadata> *thread_metadata,
          omittable_field<discordpp::ThreadMember> *member,
          omittable_field<int> *default_auto_archive_duration,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *permissions,omittable_field<int> *flags,omittable_field<int> *total_message_sent,
          omittable_field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>
          *available_tags,
          omittable_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
          *applied_tags,nullable_omittable_field<discordpp::DefaultReaction> *default_reaction_emoji
          ,omittable_field<int> *default_thread_rate_limit_per_user,
          nullable_omittable_field<int> *default_sort_order,
          omittable_field<int> *default_forum_layout)

{
  field<discordpp::Snowflake>::field(&this->id,id);
  field<int>::field(&this->type,type);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id,guild_id);
  omittable_field<int>::omittable_field(&this->position,position);
  omittable_field<std::vector<discordpp::Overwrite,_std::allocator<discordpp::Overwrite>_>_>::
  omittable_field(&this->permission_overwrites,permission_overwrites);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->name,name);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->topic,topic);
  omittable_field<bool>::omittable_field(&this->nsfw,nsfw);
  nullable_omittable_field<discordpp::Snowflake>::nullable_omittable_field
            (&this->last_message_id,last_message_id);
  omittable_field<int>::omittable_field(&this->bitrate,bitrate);
  omittable_field<int>::omittable_field(&this->user_limit,user_limit);
  omittable_field<int>::omittable_field(&this->rate_limit_per_user,rate_limit_per_user);
  omittable_field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::omittable_field
            (&this->recipients,recipients);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->icon,icon);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->owner_id,owner_id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->application_id,application_id);
  omittable_field<bool>::omittable_field(&this->managed,managed);
  nullable_omittable_field<discordpp::Snowflake>::nullable_omittable_field
            (&this->parent_id,parent_id);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->last_pin_timestamp,last_pin_timestamp);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->rtc_region,rtc_region);
  omittable_field<int>::omittable_field(&this->video_quality_mode,video_quality_mode);
  omittable_field<int>::omittable_field(&this->message_count,message_count);
  omittable_field<int>::omittable_field(&this->member_count,member_count);
  omittable_field<discordpp::ThreadMetadata>::omittable_field
            (&this->thread_metadata,thread_metadata);
  omittable_field<discordpp::ThreadMember>::omittable_field(&this->member,member);
  omittable_field<int>::omittable_field
            (&this->default_auto_archive_duration,default_auto_archive_duration);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->permissions,permissions);
  omittable_field<int>::omittable_field(&this->flags,flags);
  omittable_field<int>::omittable_field(&this->total_message_sent,total_message_sent);
  omittable_field<std::vector<discordpp::ForumTag,_std::allocator<discordpp::ForumTag>_>_>::
  omittable_field(&this->available_tags,available_tags);
  omittable_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::
  omittable_field(&this->applied_tags,applied_tags);
  nullable_omittable_field<discordpp::DefaultReaction>::nullable_omittable_field
            (&this->default_reaction_emoji,default_reaction_emoji);
  omittable_field<int>::omittable_field
            (&this->default_thread_rate_limit_per_user,default_thread_rate_limit_per_user);
  nullable_omittable_field<int>::nullable_omittable_field
            (&this->default_sort_order,default_sort_order);
  omittable_field<int>::omittable_field(&this->default_forum_layout,default_forum_layout);
  return;
}

Assistant:

Channel(
        field<Snowflake> id = uninitialized,
        field<int> type = uninitialized,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<int> position = omitted,
        omittable_field<std::vector<Overwrite> > permission_overwrites = omitted,
        nullable_omittable_field<std::string> name = omitted,
        nullable_omittable_field<std::string> topic = omitted,
        omittable_field<bool> nsfw = omitted,
        nullable_omittable_field<Snowflake> last_message_id = omitted,
        omittable_field<int> bitrate = omitted,
        omittable_field<int> user_limit = omitted,
        omittable_field<int> rate_limit_per_user = omitted,
        omittable_field<std::vector<User> > recipients = omitted,
        nullable_omittable_field<std::string> icon = omitted,
        omittable_field<Snowflake> owner_id = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<bool> managed = omitted,
        nullable_omittable_field<Snowflake> parent_id = omitted,
        nullable_omittable_field<Timestamp> last_pin_timestamp = omitted,
        nullable_omittable_field<std::string> rtc_region = omitted,
        omittable_field<int> video_quality_mode = omitted,
        omittable_field<int> message_count = omitted,
        omittable_field<int> member_count = omitted,
        omittable_field<ThreadMetadata> thread_metadata = omitted,
        omittable_field<ThreadMember> member = omitted,
        omittable_field<int> default_auto_archive_duration = omitted,
        omittable_field<std::string> permissions = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<int> total_message_sent = omitted,
        omittable_field<std::vector<ForumTag> > available_tags = omitted,
        omittable_field<std::vector<Snowflake> > applied_tags = omitted,
        nullable_omittable_field<DefaultReaction> default_reaction_emoji = omitted,
        omittable_field<int> default_thread_rate_limit_per_user = omitted,
        nullable_omittable_field<int> default_sort_order = omitted,
        omittable_field<int> default_forum_layout = omitted
    ):
        id(id),
        type(type),
        guild_id(guild_id),
        position(position),
        permission_overwrites(permission_overwrites),
        name(name),
        topic(topic),
        nsfw(nsfw),
        last_message_id(last_message_id),
        bitrate(bitrate),
        user_limit(user_limit),
        rate_limit_per_user(rate_limit_per_user),
        recipients(recipients),
        icon(icon),
        owner_id(owner_id),
        application_id(application_id),
        managed(managed),
        parent_id(parent_id),
        last_pin_timestamp(last_pin_timestamp),
        rtc_region(rtc_region),
        video_quality_mode(video_quality_mode),
        message_count(message_count),
        member_count(member_count),
        thread_metadata(thread_metadata),
        member(member),
        default_auto_archive_duration(default_auto_archive_duration),
        permissions(permissions),
        flags(flags),
        total_message_sent(total_message_sent),
        available_tags(available_tags),
        applied_tags(applied_tags),
        default_reaction_emoji(default_reaction_emoji),
        default_thread_rate_limit_per_user(default_thread_rate_limit_per_user),
        default_sort_order(default_sort_order),
        default_forum_layout(default_forum_layout)
    {}